

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O2

void __thiscall
VPLGrammar::Parser::CompoundStatementNode::BuildProgram
          (CompoundStatementNode *this,Scope *scope,ostream *out)

{
  pointer puVar1;
  ASTNodeBasic *pAVar2;
  unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> *child;
  pointer puVar3;
  
  std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::emplace_back<>(&scope->scopes_);
  puVar1 = (this->super_ASTNodeBasic).children_.
           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->super_ASTNodeBasic).children_.
                super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pAVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
             ._M_t.
             super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
             .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl;
    (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
  }
  std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::pop_back(&scope->scopes_);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                scope->OpenScope();
                for (const auto& child : children_) {
                    child->BuildProgram(scope, out);
                }
                scope->CloseScope();
            }